

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

bool QtPrivate::q_points_into_range<QArrayDataPointer<int>,int_const*>
               (int **p,QArrayDataPointer<int> *c)

{
  undefined8 uVar1;
  bool bVar2;
  int *__last;
  int *piVar3;
  difference_type dVar4;
  undefined8 *in_RDI;
  int *in_stack_ffffffffffffffe8;
  
  uVar1 = *in_RDI;
  __last = std::data<QArrayDataPointer<int>>((QArrayDataPointer<int> *)0xa70c65);
  piVar3 = std::data<QArrayDataPointer<int>>((QArrayDataPointer<int> *)0xa70c74);
  std::begin<QArrayDataPointer<int>>((QArrayDataPointer<int> *)0xa70c83);
  std::end<QArrayDataPointer<int>>((QArrayDataPointer<int> *)0xa70c91);
  dVar4 = std::distance<int_const*>(in_stack_ffffffffffffffe8,__last);
  bVar2 = q_points_into_range<int,std::less<void>>(uVar1,__last,piVar3 + dVar4);
  return bVar2;
}

Assistant:

static constexpr bool q_points_into_range(const T &p, const C &c) noexcept
{
    static_assert(std::is_same_v<decltype(std::data(c)), T>);

    // std::distance because QArrayDataPointer has a "qsizetype size"
    // member but no size() function
    return q_points_into_range(p, std::data(c),
                               std::data(c) + std::distance(std::begin(c), std::end(c)));
}